

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

QString * Message::getMessages(void)

{
  bool bVar1;
  reference s;
  QString *in_RDI;
  QString *message;
  
  QString::QString(in_RDI);
  while (bVar1 = std::queue<QString,_std::deque<QString,_std::allocator<QString>_>_>::empty
                           (&messageQueue), !bVar1) {
    s = std::queue<QString,_std::deque<QString,_std::allocator<QString>_>_>::front(&messageQueue);
    QString::operator+=(in_RDI,s);
    std::queue<QString,_std::deque<QString,_std::allocator<QString>_>_>::pop(&messageQueue);
  }
  return in_RDI;
}

Assistant:

QString Message::getMessages()
{
    QString message;
    while ( messageQueue.empty() == false )
    {
        message += messageQueue.front();
        messageQueue.pop();
    }

    return message;
}